

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnginput.cc
# Opt level: O3

void __thiscall
PngInput::readImage(PngInput *this,void *bufferOut,size_t bufferOutByteCount,uint32_t param_3,
                   uint32_t param_4,FormatDescriptor *format)

{
  ushort *puVar1;
  uint uVar2;
  uint w;
  uint h;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint32_t uVar7;
  size_t i;
  ulong uVar8;
  long lVar9;
  runtime_error *prVar10;
  uint uVar11;
  byte bVar12;
  ulong uVar13;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  undefined1 auVar35 [16];
  long lVar38;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  string local_a8;
  string local_88;
  char *local_68;
  char *local_58;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  local_48;
  
  aVar14 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
            )*(anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
               *)&(this->super_ImageInput).images;
  if ((format->samples).
      super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      (format->samples).
      super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    format = (FormatDescriptor *)aVar14;
  }
  uVar2 = ((extendedDescriptor *)&((format_arg *)format)->type_)->channelCount;
  w = *(uint *)&((FormatDescriptor *)(aVar14.values_ + 7))->basic;
  h = *(uint *)&(((FormatDescriptor *)(aVar14.values_ + 7))->basic).field_0x4;
  aVar14 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
            )format;
  uVar7 = FormatDescriptor::largestChannelBitLength(format);
  uVar11 = 0;
  do {
    uVar16 = 1 << ((byte)uVar11 & 0x1f);
    if (uVar7 - 1 < uVar16) {
      uVar18 = 8;
      if (((2 < uVar11) && (uVar18 = uVar16, uVar16 != 8)) && (uVar16 != 0x10)) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_a8._M_dataplus._M_p = (pointer)(ulong)uVar16;
        fmt_02.size_ = 2;
        fmt_02.data_ = (char *)0x47;
        args_02.field_1.args_ = aVar14.args_;
        args_02.desc_ = (unsigned_long_long)&local_a8;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_88,
                   (v10 *)"PNG decode error: Requested decode into {}-bit format is not supported.",
                   fmt_02,args_02);
        std::runtime_error::runtime_error(prVar10,(string *)&local_88);
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_001d566d;
    }
    uVar11 = uVar11 + 1;
  } while (uVar11 != 0x20);
  uVar18 = 8;
LAB_001d566d:
  uVar11 = (uint)*(ulong *)((pointer *)((long)format + 0x50))[1];
  if ((*(ulong *)((pointer *)((long)format + 0x50))[1] & 0xf0000000) != 0) {
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_88.field_2._M_allocated_capacity = (size_type)" Linear";
    if ((uVar11 >> 0x1c & 1) == 0) {
      local_88.field_2._M_allocated_capacity = (size_type)"";
    }
    local_68 = " Exponent";
    if ((uVar11 >> 0x1d & 1) == 0) {
      local_68 = "";
    }
    local_58 = " Signed";
    if ((uVar11 >> 0x1e & 1) == 0) {
      local_58 = "";
    }
    local_88._M_dataplus._M_p = (pointer)(ulong)uVar18;
    local_48.values_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)0x216fc2;
    if (-1 < (int)uVar11) {
      local_48.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)0x217ddc;
    }
    fmt.size_ = 0xcccc2;
    fmt.data_ = (char *)0x51;
    args.field_1.values_ = local_48.values_;
    args.desc_ = (unsigned_long_long)&local_88;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_a8,
               (v10 *)
               "PNG decode error: Requested format conversion to {}-bit{}{}{}{} is not supported.",
               fmt,args);
    std::runtime_error::runtime_error(prVar10,(string *)&local_a8);
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  (this->state).super_LodePNGState.info_raw.bitdepth = uVar18;
  uVar11 = ((extendedDescriptor *)&((format_arg *)format)->type_)->channelCount - 1;
  if (3 < uVar11) {
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_a8._M_dataplus._M_p =
         (pointer)(ulong)((extendedDescriptor *)&((format_arg *)format)->type_)->channelCount;
    fmt_00.size_ = 2;
    fmt_00.data_ = (char *)0x45;
    args_00.field_1.args_ = aVar14.args_;
    args_00.desc_ = (unsigned_long_long)&local_a8;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_88,
               (v10 *)"PNG decode error: Requested decode into {} channels is not supported.",fmt_00
               ,args_00);
    std::runtime_error::runtime_error(prVar10,(string *)&local_88);
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  (this->state).super_LodePNGState.info_raw.colortype =
       *(LodePNGColorType *)(&DAT_0021a6b0 + (ulong)uVar11 * 4);
  aVar14 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
            )this->pIdat;
  uVar11 = lodepng_finish_decode
                     ((uchar *)bufferOut,bufferOutByteCount,w,h,&(this->state).super_LodePNGState,
                      aVar14.values_,this->idatsize);
  if (uVar11 != 0) {
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_a8._M_dataplus._M_p = lodepng_error_text(uVar11);
    fmt_01.size_ = 0xc;
    fmt_01.data_ = (char *)0x15;
    args_01.field_1.values_ = aVar14.values_;
    args_01.desc_ = (unsigned_long_long)&local_a8;
    ::fmt::v10::vformat_abi_cxx11_(&local_88,(v10 *)"PNG decode error: {}.",fmt_01,args_01);
    std::runtime_error::runtime_error(prVar10,(string *)&local_88);
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (bufferOutByteCount != 0 && uVar18 == 0x10) {
    uVar8 = 0;
    do {
      puVar1 = (ushort *)((long)bufferOut + uVar8);
      *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
      uVar8 = uVar8 + 2;
    } while (uVar8 < bufferOutByteCount);
  }
  auVar6 = _DAT_001fb590;
  auVar5 = _DAT_001fb370;
  if ((this->state).super_LodePNGState.info_png.sbit_defined != 0) {
    local_88._M_dataplus._M_p = *(pointer *)&(this->state).super_LodePNGState.info_png.sbit_r;
    local_88._M_string_length._0_4_ = (this->state).super_LodePNGState.info_png.sbit_b;
    local_88._M_string_length._4_4_ = (this->state).super_LodePNGState.info_png.sbit_a;
    if (h != 0) {
      uVar11 = 0;
      do {
        if (w != 0) {
          uVar16 = 0;
          do {
            if ((ulong)uVar2 != 0) {
              uVar8 = 0;
              do {
                uVar15 = (ulong)((uVar16 + uVar11 * w) * uVar2 + (int)uVar8);
                uVar3 = *(uint *)((long)&local_88._M_dataplus._M_p + uVar8 * 4);
                uVar13 = CONCAT44(0,uVar3);
                bVar12 = (byte)uVar3;
                if (uVar18 == 8) {
                  if (0x1f < uVar3 - 1) {
LAB_001d5a4d:
                    __assert_fail("sourceBits > 0 && sourceBits <= 32",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                                  ,0xee,
                                  "uint32_t imageio::convertUNORM(uint32_t, uint32_t, uint32_t)");
                  }
                  uVar17 = ~(-1 << (bVar12 & 0x1f)) &
                           (uint)(*(byte *)((long)bufferOut + uVar15) >> (8 - bVar12 & 0x1f));
                  if (uVar13 != 8) {
                    if (uVar3 < 9) {
                      auVar4._8_8_ = 0;
                      auVar4._0_8_ = uVar13;
                      auVar4 = (ZEXT816(0) << 0x40 | ZEXT816(7)) / auVar4;
                      iVar31 = auVar4._0_4_;
                      auVar35 = ZEXT416(uVar3) << 0x40;
                      auVar19._0_8_ = auVar4._0_8_;
                      auVar19._8_4_ = iVar31;
                      auVar19._12_4_ = 0;
                      lVar9 = 2;
                      auVar23 = (undefined1  [16])0x0;
                      do {
                        auVar27 = auVar23;
                        lVar38 = auVar35._8_8_;
                        auVar23._0_8_ = ((ulong)uVar17 << 8 - auVar35._0_8_) >> uVar13;
                        auVar23._8_8_ = ((ulong)uVar17 << 8 - lVar38) >> uVar13;
                        auVar23 = auVar23 | auVar27;
                        auVar35._0_8_ = auVar35._0_8_ + (ulong)uVar3 * 2;
                        auVar35._8_8_ = lVar38 + (ulong)uVar3 * 2;
                        lVar38 = (ulong)(iVar31 + 2U & 0xe) + lVar9;
                        lVar9 = lVar9 + -2;
                      } while (lVar38 != 4);
                      lVar9 = -lVar9;
                      auVar24._8_4_ = (int)lVar9;
                      auVar24._0_8_ = lVar9;
                      auVar24._12_4_ = (int)((ulong)lVar9 >> 0x20);
                      auVar19 = auVar19 ^ auVar5;
                      auVar25 = (auVar24 | auVar6) ^ auVar5;
                      iVar31 = -(uint)(auVar19._0_4_ < auVar25._0_4_);
                      iVar32 = -(uint)(auVar19._4_4_ < auVar25._4_4_);
                      iVar33 = -(uint)(auVar19._8_4_ < auVar25._8_4_);
                      iVar34 = -(uint)(auVar19._12_4_ < auVar25._12_4_);
                      auVar36._4_4_ = iVar31;
                      auVar36._0_4_ = iVar31;
                      auVar36._8_4_ = iVar33;
                      auVar36._12_4_ = iVar33;
                      iVar31 = -(uint)(auVar25._4_4_ == auVar19._4_4_);
                      iVar33 = -(uint)(auVar25._12_4_ == auVar19._12_4_);
                      auVar20._4_4_ = iVar31;
                      auVar20._0_4_ = iVar31;
                      auVar20._8_4_ = iVar33;
                      auVar20._12_4_ = iVar33;
                      auVar26._4_4_ = iVar32;
                      auVar26._0_4_ = iVar32;
                      auVar26._8_4_ = iVar34;
                      auVar26._12_4_ = iVar34;
                      auVar26 = auVar26 | auVar20 & auVar36;
                      auVar27 = ~auVar26 & auVar23 | auVar27 & auVar26;
                      uVar17 = auVar27._8_4_ | auVar27._0_4_;
                    }
                    else {
                      uVar17 = (uVar17 >> (bVar12 - 8 & 0x1f)) +
                               (uint)((uVar17 >> (uVar3 - 9 & 0x1f) & 1) != 0);
                    }
                  }
                  *(char *)((long)bufferOut + uVar15) = (char)uVar17;
                }
                else {
                  if (0x1f < uVar3 - 1) goto LAB_001d5a4d;
                  uVar17 = ~(-1 << (bVar12 & 0x1f)) &
                           (uint)(*(ushort *)((long)bufferOut + uVar15 * 2) >>
                                 (0x10 - bVar12 & 0x1f));
                  if (uVar3 != 0x10) {
                    if (uVar3 < 0x11) {
                      auVar27._8_8_ = 0;
                      auVar27._0_8_ = uVar13;
                      auVar27 = (ZEXT816(0) << 0x40 | ZEXT816(0xf)) / auVar27;
                      iVar31 = auVar27._0_4_;
                      auVar29 = ZEXT416(uVar3) << 0x40;
                      auVar21._0_8_ = auVar27._0_8_;
                      auVar21._8_4_ = iVar31;
                      auVar21._12_4_ = 0;
                      lVar9 = 2;
                      auVar25 = (undefined1  [16])0x0;
                      do {
                        auVar27 = auVar25;
                        lVar38 = auVar29._8_8_;
                        auVar25._0_8_ = ((ulong)uVar17 << 0x10 - auVar29._0_8_) >> uVar13;
                        auVar25._8_8_ = ((ulong)uVar17 << 0x10 - lVar38) >> uVar13;
                        auVar25 = auVar25 | auVar27;
                        auVar29._0_8_ = auVar29._0_8_ + (ulong)uVar3 * 2;
                        auVar29._8_8_ = lVar38 + (ulong)uVar3 * 2;
                        lVar38 = (ulong)(iVar31 + 2U & 0x1e) + lVar9;
                        lVar9 = lVar9 + -2;
                      } while (lVar38 != 4);
                      lVar9 = -lVar9;
                      auVar28._8_4_ = (int)lVar9;
                      auVar28._0_8_ = lVar9;
                      auVar28._12_4_ = (int)((ulong)lVar9 >> 0x20);
                      auVar21 = auVar21 ^ auVar5;
                      auVar29 = (auVar28 | auVar6) ^ auVar5;
                      iVar31 = -(uint)(auVar21._0_4_ < auVar29._0_4_);
                      iVar32 = -(uint)(auVar21._4_4_ < auVar29._4_4_);
                      iVar33 = -(uint)(auVar21._8_4_ < auVar29._8_4_);
                      iVar34 = -(uint)(auVar21._12_4_ < auVar29._12_4_);
                      auVar37._4_4_ = iVar31;
                      auVar37._0_4_ = iVar31;
                      auVar37._8_4_ = iVar33;
                      auVar37._12_4_ = iVar33;
                      iVar31 = -(uint)(auVar29._4_4_ == auVar21._4_4_);
                      iVar33 = -(uint)(auVar29._12_4_ == auVar21._12_4_);
                      auVar22._4_4_ = iVar31;
                      auVar22._0_4_ = iVar31;
                      auVar22._8_4_ = iVar33;
                      auVar22._12_4_ = iVar33;
                      auVar30._4_4_ = iVar32;
                      auVar30._0_4_ = iVar32;
                      auVar30._8_4_ = iVar34;
                      auVar30._12_4_ = iVar34;
                      auVar30 = auVar30 | auVar22 & auVar37;
                      auVar27 = ~auVar30 & auVar25 | auVar27 & auVar30;
                      uVar17 = auVar27._8_4_ | auVar27._0_4_;
                    }
                    else {
                      uVar17 = (uVar17 >> (bVar12 - 0x10 & 0x1f)) +
                               (uint)((uVar17 >> (uVar3 - 0x11 & 0x1f) & 1) != 0);
                    }
                  }
                  *(short *)((long)bufferOut + uVar15 * 2) = (short)uVar17;
                }
                uVar8 = uVar8 + 1;
              } while (uVar8 != uVar2);
            }
            uVar16 = uVar16 + 1;
          } while (uVar16 != w);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != h);
    }
  }
  return;
}

Assistant:

void
PngInput::readImage(void* bufferOut, size_t bufferOutByteCount,
                    uint32_t /*subimage*/, uint32_t /*miplevel*/,
                    const FormatDescriptor& format)
{
    const auto& targetFormat = format.isUnknown() ? spec().format() : format;

    const auto channelCount = targetFormat.channelCount();
    const auto height = spec().height();
    const auto width = spec().width();
    const auto targetBitLength = targetFormat.largestChannelBitLength();
    const auto requestBits = std::max(imageio::bit_ceil(targetBitLength), 8u);

    if (requestBits != 8 && requestBits != 16)
        throw std::runtime_error(fmt::format(
                "PNG decode error: Requested decode into {}-bit format is not supported.",
                requestBits)
              );

    const bool targetL = targetFormat.samples[0].qualifierLinear;
    const bool targetE = targetFormat.samples[0].qualifierExponent;
    const bool targetS = targetFormat.samples[0].qualifierSigned;
    const bool targetF = targetFormat.samples[0].qualifierFloat;

    // Only UNORM requests are allowed for PNG inputs
    if (targetE || targetL || targetS || targetF)
        throw std::runtime_error(fmt::format(
                "PNG decode error: Requested format conversion to {}-bit{}{}{}{} is not supported.",
                requestBits,
                targetL ? " Linear" : "",
                targetE ? " Exponent" : "",
                targetS ? " Signed" : "",
                targetF ? " Float" : "")
              );

    state.info_raw.bitdepth = requestBits;
    state.info_raw.colortype = [&]{
        switch (targetFormat.channelCount()) {
        case 1:
            return LCT_GREY;
        case 2:
            return LCT_GREY_ALPHA;
        case 3:
            return LCT_RGB;
        case 4:
            return LCT_RGBA;
        }
        throw std::runtime_error(fmt::format(
                "PNG decode error: Requested decode into {} channels is not supported.",
                targetFormat.channelCount())
              );
    }();
    auto lodepngError = lodepng_finish_decode(
                                          (unsigned char*)bufferOut,
                                          bufferOutByteCount,
                                          width,
                                          height,
                                          &state,
                                          pIdat,
                                          idatsize);

    if (lodepngError)
        throw std::runtime_error(fmt::format(
                "PNG decode error: {}.", lodepng_error_text(lodepngError)));

    // TODO: Detect endianness
    // if constexpr (std::endian::native == std::endian::little)
    if (requestBits == 16) {
        // LodePNG loads 16 bit channels in big endian order
        auto* data = (unsigned char*) bufferOut;
        for (size_t i = 0; i < bufferOutByteCount; i += 2)
            std::swap(*(data + i), *(data + i + 1));
    }

    if (state.info_png.sbit_defined) {
        // Recalculate the UNORM values based on sBit information to ensure best loading/rounding
        // result regardless of what the png file's writer saved
        std::array<uint32_t, 4> sBits{
            state.info_png.sbit_r,
            state.info_png.sbit_g,
            state.info_png.sbit_b,
            state.info_png.sbit_a,
        };

        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                for (uint32_t c = 0; c < channelCount; ++c) {
                    const auto index = y * width * channelCount + x * channelCount + c;
                    if (requestBits == 8) {
                        auto& value = *(reinterpret_cast<uint8_t*>(bufferOut) + index);
                        value = static_cast<uint8_t>(imageio::convertUNORM(value >> (8 - sBits[c]), sBits[c], 8));
                    } else { // requestBits == 16
                        auto& value = *(reinterpret_cast<uint16_t*>(bufferOut) + index);
                        value = static_cast<uint16_t>(imageio::convertUNORM(value >> (16 - sBits[c]), sBits[c], 16));
                    }
                }
            }
        }
    }
}